

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitAtomicWait(BinaryInstWriter *this,AtomicWait *curr)

{
  ulong uVar1;
  int iVar2;
  uint64_t offset;
  size_t bytes;
  size_t alignment;
  size_t sVar3;
  char *pcVar4;
  Name memory;
  uchar local_1b [3];
  
  local_1b[2] = 0xfe;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1b + 2);
  uVar1 = (curr->expectedType).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar2 = (int)uVar1;
  if (iVar2 == 3) {
    local_1b[0] = '\x02';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1b);
    offset = (curr->offset).addr;
    sVar3 = (curr->memory).super_IString.str._M_len;
    pcVar4 = (curr->memory).super_IString.str._M_str;
    alignment = 8;
    bytes = 8;
  }
  else {
    if (iVar2 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x22e);
    }
    local_1b[1] = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1b + 1);
    offset = (curr->offset).addr;
    sVar3 = (curr->memory).super_IString.str._M_len;
    pcVar4 = (curr->memory).super_IString.str._M_str;
    alignment = 4;
    bytes = 4;
  }
  memory.super_IString.str._M_str = pcVar4;
  memory.super_IString.str._M_len = sVar3;
  emitMemoryAccess(this,alignment,bytes,offset,memory);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicWait(AtomicWait* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix);
  switch (curr->expectedType.getBasic()) {
    case Type::i32: {
      o << int8_t(BinaryConsts::I32AtomicWait);
      emitMemoryAccess(4, 4, curr->offset, curr->memory);
      break;
    }
    case Type::i64: {
      o << int8_t(BinaryConsts::I64AtomicWait);
      emitMemoryAccess(8, 8, curr->offset, curr->memory);
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}